

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O3

int configuration_object_childs_cb_iterate_valid(set_key key,set_value val)

{
  type_id tVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  size_t __n;
  char *pcVar4;
  int iVar5;
  
  tVar1 = value_type_id(val);
  iVar5 = 1;
  if (tVar1 == 7) {
    sVar3 = value_type_size(val);
    __s = configuration_impl_extension();
    __n = strlen(__s);
    if (__n + 1 < sVar3) {
      pcVar4 = value_to_string(val);
      iVar2 = strncmp(pcVar4 + ~__n + sVar3,__s,__n);
      if (iVar2 == 0) {
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int configuration_object_childs_cb_iterate_valid(set_key key, set_value val)
{
	value v = val;

	(void)key;

	/*
	static const char config_name[] = "_loader";

	const char * name = key;

	size_t name_length = strlen(name), config_name_size = sizeof(config_name);

	const char * name_last = &name[name_length - config_name_size + 1];

	if (strcmp(name_last, config_name) != 0)
	{
		return 1;
	}
	*/

	if (value_type_id(v) == TYPE_STRING)
	{
		size_t config_size = value_type_size(v);

		const char *config_extension = configuration_impl_extension();

		size_t config_length = strlen(config_extension);

		if (config_size > config_length + 1)
		{
			const char *path = value_to_string(v);

			const char *extension_last = &path[config_size - config_length - 1];

			if (strncmp(extension_last, config_extension, config_length) == 0)
			{
				return 0;
			}
		}
	}

	return 1;
}